

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_R_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Record_R_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Record_R_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pRVar3;
  KINT32 Value;
  KString local_280;
  KString local_260;
  __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
  local_240;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Record_R_PDU *local_18;
  Record_R_PDU *this_local;
  
  local_18 = this;
  this_local = (Record_R_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Record-R PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_1f0,(Simulation_Management_Header *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"\tRequest ID:                ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->super_Set_Record_R_PDU).m_ui32RqId);
  Reliability_Header::GetAsString_abi_cxx11_
            (&local_210,&(this->super_Set_Record_R_PDU).super_Reliability_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"\tEvent Type:                ");
  DATA_TYPE::ENUMS::GetEnumAsStringEventType_abi_cxx11_
            ((KString *)&citr,(ENUMS *)(ulong)this->m_ui16EvntTyp,Value);
  poVar2 = std::operator<<(poVar2,(string *)&citr);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tSerial Number:             ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui32SrlNm);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tNumber Of record Sets:     ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->super_Set_Record_R_PDU).m_ui32NumRecSets);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::
            begin(&(this->super_Set_Record_R_PDU).m_vRecs);
  local_240._M_current =
       (RecordSet *)
       std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::end
                 (&(this->super_Set_Record_R_PDU).m_vRecs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_240);
    if (!bVar1) break;
    pRVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
             ::operator->(&citrEnd);
    (*(pRVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_280);
    UTILS::IndentString(&local_260,&local_280,1,'\t');
    std::operator<<(local_190,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Record_R_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Record-R PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "\tRequest ID:                "   << m_ui32RqId
       << Reliability_Header::GetAsString()
       << "\tEvent Type:                "   << GetEnumAsStringEventType( m_ui16EvntTyp ) << "\n"
       << "\tSerial Number:             "   << m_ui32SrlNm    << "\n"
       << "\tNumber Of record Sets:     " << m_ui32NumRecSets  << "\n";

    vector<RecordSet>::const_iterator citr = m_vRecs.begin();
    vector<RecordSet>::const_iterator citrEnd = m_vRecs.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << IndentString( citr->GetAsString(), 1 );
    }

    return ss.str();
}